

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O2

void __thiscall
QSinglePointEvent::QSinglePointEvent
          (QSinglePointEvent *this,Type type,QPointingDevice *dev,QEventPoint *point,
          MouseButton button,MouseButtons buttons,KeyboardModifiers modifiers,
          MouseEventSource source)

{
  undefined4 in_register_00000034;
  
  QPointerEvent::QPointerEvent
            (&this->super_QPointerEvent,CONCAT44(in_register_00000034,type),dev,
             modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
             super_QFlagsStorage<Qt::KeyboardModifier>.i);
  *(undefined ***)&(this->super_QPointerEvent).super_QInputEvent = &PTR__QHoverEvent_0077c8b8;
  this->m_button = button;
  (this->m_mouseState).super_QFlagsStorageHelper<Qt::MouseButton,_4>.
  super_QFlagsStorage<Qt::MouseButton>.i =
       (Int)buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
            super_QFlagsStorage<Qt::MouseButton>.i;
  this->m_source = source;
  *(undefined4 *)&this->m_reserved = 0;
  QList<QEventPoint>::emplaceBack<QEventPoint_const&>(&(this->super_QPointerEvent).m_points,point);
  return;
}

Assistant:

QSinglePointEvent::QSinglePointEvent(QEvent::Type type, const QPointingDevice *dev, const QEventPoint &point,
                                     Qt::MouseButton button, Qt::MouseButtons buttons,
                                     Qt::KeyboardModifiers modifiers, Qt::MouseEventSource source)
    : QPointerEvent(type, QEvent::SinglePointEventTag{}, dev, modifiers),
      m_button(button),
      m_mouseState(buttons),
      m_source(source),
      m_reserved(0), m_reserved2(0),
      m_doubleClick(false), m_phase(0), m_invertedScrolling(0)
{
    m_points << point;
}